

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool trans_BLX_r(DisasContext_conflict1 *s,arg_BLX_r *a)

{
  ulong uVar1;
  TCGContext_conflict1 *pTVar2;
  TCGTemp *pTVar3;
  TCGv_i32 var;
  TCGContext_conflict1 *tcg_ctx;
  
  uVar1 = s->features;
  if ((short)uVar1 < 0) {
    pTVar2 = s->uc->tcg_ctx;
    pTVar3 = tcg_temp_new_internal_aarch64(pTVar2,TCG_TYPE_I32,false);
    var = (TCGv_i32)((long)pTVar3 - (long)pTVar2);
    load_reg_var(s,var,(int)a);
    tcg_gen_op2_aarch64(pTVar2,INDEX_op_movi_i32,(TCGArg)(pTVar2->cpu_R[0xe] + (long)pTVar2),
                        (long)(int)(s->thumb | (uint)(s->base).pc_next));
    pTVar2 = s->uc->tcg_ctx;
    (s->base).is_jmp = DISAS_TARGET_0;
    tcg_gen_andi_i32_aarch64(pTVar2,pTVar2->cpu_R[0xf],var,-2);
    tcg_gen_andi_i32_aarch64(pTVar2,var,var,1);
    tcg_gen_op3_aarch64(pTVar2,INDEX_op_st_i32,(TCGArg)(var + (long)pTVar2),
                        (TCGArg)(pTVar2->cpu_env + (long)pTVar2),0x220);
    tcg_temp_free_internal_aarch64(pTVar2,(TCGTemp *)(var + (long)pTVar2));
  }
  return SUB81((uVar1 & 0xffff) >> 0xf,0);
}

Assistant:

static bool trans_BLX_r(DisasContext *s, arg_BLX_r *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;

    if (!ENABLE_ARCH_5) {
        return false;
    }
    tmp = load_reg(s, a->rm);
    tcg_gen_movi_i32(tcg_ctx, tcg_ctx->cpu_R[14], s->base.pc_next | s->thumb);
    gen_bx(s, tmp);
    return true;
}